

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::MILSpec::TupleValue::_InternalSerialize
          (TupleValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint8_t *puVar2;
  Type *value;
  ulong uVar3;
  int index;
  
  iVar1 = (this->values_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Value>::TypeHandler>
                      (&(this->values_).super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::Value>(1,value,puVar2,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  uVar3 = uVar3 & 0xfffffffffffffffc;
  puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar3 + 8),*(int *)(uVar3 + 0x10),target);
  return puVar2;
}

Assistant:

uint8_t* TupleValue::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TupleValue)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.MILSpec.Value values = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_values_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_values(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TupleValue)
  return target;
}